

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O3

void Abc_ObjChangeUpdate(Abc_Obj_t *pObj,int iFanin,Mio_Cell2_t *pCells,int *pNodeInfo,
                        Vec_Int_t *vTemp)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  
  pObj->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)pCells[pNodeInfo[iFanin * 3]].pMioGate;
  iVar1 = pNodeInfo[(long)(iFanin * 3) + 1];
  vTemp->nSize = 0;
  if (0 < (pObj->vFanins).nSize) {
    bVar2 = 0;
    iVar3 = 0;
    do {
      Vec_IntPush(vTemp,(pObj->vFanins).pArray[iVar1 >> (bVar2 & 0x1f) & 0xf]);
      iVar3 = iVar3 + 1;
      bVar2 = bVar2 + 4;
    } while (iVar3 < (pObj->vFanins).nSize);
  }
  (pObj->vFanins).nSize = 0;
  if (0 < vTemp->nSize) {
    lVar4 = 0;
    do {
      Vec_IntPush(&pObj->vFanins,vTemp->pArray[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < vTemp->nSize);
  }
  return;
}

Assistant:

void Abc_ObjChangeUpdate( Abc_Obj_t * pObj, int iFanin, Mio_Cell2_t * pCells, int * pNodeInfo, Vec_Int_t * vTemp )
{
    int v, Perm, iNodeCell = pNodeInfo[3*iFanin];
    //Mio_Gate_t * pGate = (Mio_Gate_t *)pObj->pData;
    //Abc_ObjPrint( stdout, pObj );
    //printf( "Replacing fanout %d with %s by %s with fanin %d.\n", Abc_ObjId(pObj), Mio_GateReadName(pGate), Mio_GateReadName((Mio_Gate_t *)pCells[iNodeCell].pMioGate), iFanin );
    pObj->pData = (Mio_Gate_t *)pCells[iNodeCell].pMioGate;
    Perm = pNodeInfo[3*iFanin+1];
    Vec_IntClear( vTemp );
    for ( v = 0; v < Abc_ObjFaninNum(pObj); v++ )
        Vec_IntPush( vTemp, Abc_ObjFaninId(pObj, (Perm >> (v << 2)) & 15) );
    Vec_IntClear( &pObj->vFanins );
    Vec_IntAppend( &pObj->vFanins, vTemp );
}